

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
          (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this,
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *param_2)

{
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar2;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar3;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar4;
  ulong __n;
  undefined1 local_3e [14];
  
  bVar1 = *param_2;
  bVar2 = param_2[1];
  __n = (ulong)((byte)bVar1 >> 4);
  memcpy(local_3e,param_2 + 2,__n);
  local_3e[__n] = 0;
  bVar3 = *this;
  *param_2 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
             ((byte)bVar1 & 0xf0 | (byte)bVar3 & 0xf);
  bVar4 = *this;
  *param_2 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
             ((byte)bVar4 & 0xf0 | (byte)bVar3 & 0xf);
  param_2[1] = this[1];
  memcpy(param_2 + 2,this + 2,(ulong)((byte)*this >> 4));
  param_2[(ulong)((byte)bVar4 >> 4) + 2] =
       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
  *this = bVar1;
  this[1] = bVar2;
  memcpy(this + 2,local_3e,__n);
  this[__n + 2] = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }